

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O0

int cmpBitmap(uchar *buf,int width,int pitch,int height,int pf,int flags,int gray2rgb)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  long lVar10;
  int local_70;
  uchar bf;
  uchar gf;
  uchar rf;
  uchar b;
  uchar g;
  uchar r;
  int row;
  int j;
  int i;
  int ps;
  int aoffset;
  int boffset;
  int goffset;
  int roffset;
  int flags_local;
  int pf_local;
  int height_local;
  int pitch_local;
  int width_local;
  uchar *buf_local;
  
  iVar2 = tjPixelSize[pf];
  j = 0;
  do {
    if (height <= j) {
      return 1;
    }
    if ((flags & 2U) == 0) {
      local_70 = j;
    }
    else {
      local_70 = (height - j) + -1;
    }
    for (i = 0; i < width; i = i + 1) {
      uVar3 = (long)(i << 8) / (long)width;
      uVar4 = (uchar)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) % 0x100
                     );
      uVar3 = (long)(j << 8) / (long)height;
      uVar5 = (uchar)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) % 0x100
                     );
      uVar6 = (uchar)(((j << 8) / height + (i << 8) / width) % 0x100);
      if (pf == 6) {
        if (buf[local_70 * pitch + i * iVar2] != uVar6) {
          return 0;
        }
      }
      else if (pf == 0xb) {
        lVar10 = (long)(local_70 * pitch + i * iVar2);
        bVar1 = buf[lVar10 + 3];
        uVar7 = (uchar)(int)(((double)buf[lVar10] * (double)bVar1) / 255.0 + 0.5);
        uVar8 = (uchar)(int)(((double)buf[lVar10 + 1] * (double)bVar1) / 255.0 + 0.5);
        uVar9 = (uchar)(int)(((double)buf[lVar10 + 2] * (double)bVar1) / 255.0 + 0.5);
        if (gray2rgb == 0) {
          if (((uVar7 != uVar4) || (uVar8 != uVar5)) || (uVar9 != uVar6)) {
            return 0;
          }
        }
        else if (((uVar7 != uVar6) || (uVar8 != uVar6)) || (uVar9 != uVar6)) {
          return 0;
        }
      }
      else {
        if (gray2rgb == 0) {
          if (((buf[local_70 * pitch + i * iVar2 + tjRedOffset[pf]] != uVar4) ||
              (buf[local_70 * pitch + i * iVar2 + tjGreenOffset[pf]] != uVar5)) ||
             (buf[local_70 * pitch + i * iVar2 + tjBlueOffset[pf]] != uVar6)) {
            return 0;
          }
        }
        else if (((buf[local_70 * pitch + i * iVar2 + tjRedOffset[pf]] != uVar6) ||
                 (buf[local_70 * pitch + i * iVar2 + tjGreenOffset[pf]] != uVar6)) ||
                (buf[local_70 * pitch + i * iVar2 + tjBlueOffset[pf]] != uVar6)) {
          return 0;
        }
        if ((-1 < tjAlphaOffset[pf]) &&
           (buf[local_70 * pitch + i * iVar2 + tjAlphaOffset[pf]] != 0xff)) {
          return 0;
        }
      }
    }
    j = j + 1;
  } while( true );
}

Assistant:

static int cmpBitmap(unsigned char *buf, int width, int pitch, int height,
                     int pf, int flags, int gray2rgb)
{
  int roffset = tjRedOffset[pf];
  int goffset = tjGreenOffset[pf];
  int boffset = tjBlueOffset[pf];
  int aoffset = tjAlphaOffset[pf];
  int ps = tjPixelSize[pf];
  int i, j;

  for (j = 0; j < height; j++) {
    int row = (flags & TJFLAG_BOTTOMUP) ? height - j - 1 : j;

    for (i = 0; i < width; i++) {
      unsigned char r = (i * 256 / width) % 256;
      unsigned char g = (j * 256 / height) % 256;
      unsigned char b = (j * 256 / height + i * 256 / width) % 256;

      if (pf == TJPF_GRAY) {
        if (buf[row * pitch + i * ps] != b)
          return 0;
      } else if (pf == TJPF_CMYK) {
        unsigned char rf, gf, bf;

        cmyk_to_rgb(buf[row * pitch + i * ps + 0],
                    buf[row * pitch + i * ps + 1],
                    buf[row * pitch + i * ps + 2],
                    buf[row * pitch + i * ps + 3], &rf, &gf, &bf);
        if (gray2rgb) {
          if (rf != b || gf != b || bf != b)
            return 0;
        } else if (rf != r || gf != g || bf != b) return 0;
      } else {
        if (gray2rgb) {
          if (buf[row * pitch + i * ps + roffset] != b ||
              buf[row * pitch + i * ps + goffset] != b ||
              buf[row * pitch + i * ps + boffset] != b)
            return 0;
        } else if (buf[row * pitch + i * ps + roffset] != r ||
                   buf[row * pitch + i * ps + goffset] != g ||
                   buf[row * pitch + i * ps + boffset] != b)
          return 0;
        if (aoffset >= 0 && buf[row * pitch + i * ps + aoffset] != 0xFF)
          return 0;
      }
    }
  }
  return 1;
}